

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O3

void cursor_hidden_bitmap(int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint *puVar17;
  uint *puVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int local_5c;
  uint *local_50;
  uint *local_48;
  
  uVar4 = displaywidth;
  uVar14 = displaywidth + 0xf;
  if (-1 < (int)displaywidth) {
    uVar14 = displaywidth;
  }
  iVar2 = displaywidth - x;
  if (x + 0x10 <= (int)displaywidth) {
    iVar2 = 0x10;
  }
  LastCursorClippingY = displayheight - y;
  if (y + 0x10 <= (int)displayheight) {
    LastCursorClippingY = 0x10;
  }
  uVar10 = iVar2 - 1U & 0x1f;
  uVar20 = -1 << (~(byte)uVar10 & 0x1f);
  if (x < 0) {
    uVar6 = -(ulong)(7U - x >> 3);
  }
  else {
    uVar6 = (ulong)((uint)x >> 3);
  }
  uVar6 = (long)DisplayRegion68k + uVar6 + (long)(((int)uVar14 >> 4) * y) * 2;
  LastCursorClippingX = iVar2;
  if (0 < LastCursorClippingY) {
    local_50 = (uint *)(uVar6 & 0xfffffffffffffffc);
    uVar14 = (x & 7U) + ((uint)uVar6 & 3) * 8;
    iVar9 = -uVar14;
    uVar16 = 0xffffffff;
    uVar19 = 0;
    uVar21 = -(uint)(uVar14 == 0) | ~(-1 << ((byte)uVar14 & 0x1f));
    local_48 = (uint *)MonoCursor_savebitmap;
    uVar12 = 0;
    uVar11 = uVar20;
    iVar3 = LastCursorClippingY;
    uVar13 = uVar14;
    iVar15 = iVar2;
    uVar5 = uVar14;
    do {
      local_5c = uVar5 + iVar2;
      bVar7 = (byte)iVar9 & 0x1f;
      bVar8 = (byte)uVar13;
      if (uVar12 < uVar14) {
        uVar13 = *local_50 << (bVar8 & 0x1f);
        if (0x20 < (int)(iVar2 + uVar14)) {
          puVar18 = local_50 + 2;
          uVar19 = local_50[1] << (bVar8 & 0x1f);
          uVar13 = uVar13 | local_50[1] >> bVar7 & uVar21;
          goto LAB_00129432;
        }
        puVar18 = local_50 + 1;
      }
      else {
        puVar18 = local_50 + 1;
        uVar19 = *local_50 << (bVar8 & 0x1f);
        uVar13 = *local_50 >> bVar7 & uVar21;
LAB_00129432:
        uVar19 = ~uVar21 & uVar19;
      }
      puVar17 = local_48;
      if ((int)(iVar2 + uVar12) < 0x21) {
LAB_0012945d:
        *puVar17 = (uVar13 ^ *puVar17) & uVar20 ^ *puVar17;
      }
      else {
        uVar20 = iVar15 >> 5;
        *local_48 = (uVar13 ^ *local_48) & uVar16 ^ *local_48;
        puVar17 = local_48 + 1;
        if (uVar14 == uVar12) {
          if (1 < (int)uVar20) {
            do {
              uVar13 = *puVar18;
              puVar18 = puVar18 + 1;
              *puVar17 = uVar13;
              puVar17 = puVar17 + 1;
              uVar20 = uVar20 - 1;
            } while (1 < uVar20);
          }
        }
        else if (1 < (int)uVar20) {
          do {
            uVar13 = *puVar18;
            puVar18 = puVar18 + 1;
            uVar5 = uVar13 >> bVar7 | uVar19;
            uVar19 = uVar13 << (bVar8 & 0x1f);
            *puVar17 = uVar5;
            puVar17 = puVar17 + 1;
            uVar20 = uVar20 - 1;
          } while (1 < uVar20);
        }
        if (uVar10 != 0x1f) {
          uVar20 = uVar11;
          uVar13 = uVar19;
          if ((local_5c - 1U & 0x1f) <= uVar10) {
            uVar13 = *puVar18 >> bVar7 & uVar21 | uVar19;
          }
          goto LAB_0012945d;
        }
      }
      uVar13 = uVar12 + 0x10;
      local_48 = local_48 + (uVar13 >> 5);
      uVar12 = uVar13 & 0x1f;
      uVar10 = (iVar2 + uVar12) - 1 & 0x1f;
      uVar16 = -(uint)(uVar12 == 0) | ~(-1 << (-(char)uVar12 & 0x1fU));
      uVar11 = -1 << (~(byte)uVar10 & 0x1f);
      uVar20 = uVar11 & uVar16;
      uVar5 = uVar14 + uVar4;
      iVar9 = uVar12 - uVar5;
      uVar13 = uVar5 - uVar13 & 0x1f;
      local_50 = local_50 + ((int)uVar5 >> 5);
      uVar14 = uVar5 & 0x1f;
      uVar21 = -(uint)(uVar13 == 0) | ~(-1 << (sbyte)uVar13);
      iVar15 = iVar2 + uVar12;
      bVar1 = 1 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void cursor_hidden_bitmap(int x, int y)
{
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;
  /* save image */
  srcbase = DisplayRegion68k + (y * DLWORD_PERLINE);
  dstbase = MonoCursor_savebitmap;
  sx = x;
  dx = 0;
  CursorClippingX(x, w); /* w and LastCursorClippingX rest */
  CursorClippingY(y, h); /* h and LastCursorClippingY reset */
  srcbpl = displaywidth;
  dstbpl = HARD_CURSORWIDTH;
  op = 0; /* replace */
  new_bitblt_code;
}